

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas.c
# Opt level: O3

char * borg_restock_dynamic(int depth)

{
  int *piVar1;
  int formula;
  void **ppvVar2;
  long lVar3;
  
  if (0 < borg_formulas.restock.count) {
    lVar3 = 0;
    ppvVar2 = borg_formulas.restock.items;
    do {
      piVar1 = (int *)ppvVar2[lVar3];
      if (depth < *piVar1) {
        return (char *)0x0;
      }
      formula = *(int *)(*(char **)(piVar1 + 4) + 4);
      if (**(char **)(piVar1 + 4) == '\x01') {
        formula = borg_calculate_dynamic(formula,depth);
        ppvVar2 = borg_formulas.restock.items;
      }
      if (formula != 0) {
        return *(char **)(piVar1 + 2);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < borg_formulas.restock.count);
  }
  return (char *)0x0;
}

Assistant:

const char *borg_restock_dynamic(int depth)
{
    int i;

    for (i = 0; i < borg_formulas.restock.count; i++) {
        struct borg_depth_line *d = borg_formulas.restock.items[i];
        if (d->dlevel > depth)
            break;
        if (check_condition(d->condition, depth))
            return d->reason;
    }

    return NULL;
}